

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_server.cc
# Opt level: O3

ssl_hs_wait_t bssl::tls13_server_handshake(SSL_HANDSHAKE *hs)

{
  uint8_t *puVar1;
  SSLCredentialType SVar2;
  ssl_credential_st *psVar3;
  SSL_HANDSHAKE_HINTS *pSVar4;
  SSL *pSVar5;
  SSL_CREDENTIAL *cred;
  SSLPAKEShare *pSVar6;
  size_t sVar7;
  ssl_session_st *psVar8;
  _func_int_SSL_CLIENT_HELLO_ptr *p_Var9;
  _func_bool_SSL_ptr_Array<unsigned_char> *p_Var10;
  Span<const_unsigned_char> id_prover;
  Span<const_unsigned_char> context;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  Span<const_unsigned_char> traffic_secret;
  Span<const_unsigned_char> traffic_secret_00;
  Span<const_unsigned_char> payload;
  Span<const_unsigned_char> traffic_secret_01;
  Span<const_unsigned_char> traffic_secret_02;
  Span<const_unsigned_char> traffic_secret_03;
  Span<const_unsigned_char> traffic_secret_04;
  Span<const_unsigned_char> msg_00;
  Span<const_unsigned_char> msg_01;
  Span<const_unsigned_char> ticket;
  Span<const_unsigned_char> id_verifier;
  Span<const_unsigned_char> w0;
  Span<const_unsigned_char> registration_record;
  UniquePtr<SSL_SESSION> *pUVar14;
  UniquePtr<spake2plus::Verifier> *pUVar15;
  undefined1 auVar16 [8];
  CBB *__p_00;
  bssl *this;
  InplaceVector<unsigned_char,_64UL> *out;
  undefined2 uVar17;
  EVP_HPKE_CTX *ctx;
  bool bVar18;
  bool bVar19;
  uint16_t uVar20;
  uint16_t uVar21;
  ssl_verify_result_t sVar22;
  int iVar23;
  int iVar24;
  ssl_ticket_aead_result_t sVar25;
  ssl_private_key_result_t sVar26;
  uint uVar27;
  pointer __p_1;
  size_t sVar28;
  EVP_HPKE_KDF *kdf;
  EVP_HPKE_AEAD *aead;
  SSL3_STATE *pSVar29;
  uchar *puVar30;
  unsigned_short *puVar31;
  SSL_CIPHER *pSVar32;
  ulong uVar33;
  undefined7 extraout_var;
  Verifier *pVVar34;
  EVP_MD *md;
  undefined4 extraout_var_00;
  byte bVar35;
  ssl_hs_wait_t sVar36;
  ssl_hs_wait_t sVar37;
  uint *puVar38;
  SSL_CONFIG *pSVar39;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  ptrdiff_t _Num_1;
  undefined1 *puVar40;
  SSL *pSVar41;
  SSL_CLIENT_HELLO *in_R9;
  SSL_CLIENT_HELLO *client_hello_00;
  int line;
  pointer __p;
  ssl_hs_wait_t sVar42;
  ptrdiff_t _Num_2;
  Array<unsigned_char> *pAVar43;
  Span<const_unsigned_char> client_random;
  Span<const_unsigned_char> client_random_00;
  Span<unsigned_char> out_00;
  Array<unsigned_char> AVar44;
  Span<const_unsigned_char> in;
  Span<const_unsigned_char> in_00;
  Span<const_unsigned_char> in_01;
  CBS cipher_suites;
  Span<const_unsigned_char> psk;
  Span<unsigned_char> out_01;
  Array<unsigned_char> AVar45;
  Span<const_unsigned_char> in_02;
  OPENSSL_timeval OVar46;
  bool unused;
  uint8_t type;
  SSLMessage msg;
  CBB extensions;
  uint16_t sigalg;
  CBB session_id;
  uint8_t alert;
  uint8_t config_id;
  uint16_t aead_id;
  SSL_CLIENT_HELLO client_hello;
  CBB sigalgs_cbb;
  CBB sigalg_contents;
  undefined4 in_stack_fffffffffffffcf8;
  undefined4 uVar47;
  undefined4 uVar48;
  undefined4 in_stack_fffffffffffffcfc;
  CBS *out_02;
  CBS *pCVar49;
  SSL_SESSION *in_stack_fffffffffffffd00;
  bool local_2c1;
  SSL *local_2c0;
  Array<unsigned_char> local_2b8;
  SSL_CLIENT_HELLO *local_2a8;
  UniquePtr<SSL_SESSION> *local_2a0;
  undefined1 local_298 [8];
  uint8_t *local_290;
  anon_union_32_2_4f6aaa2e_for_u aStack_288;
  UniquePtr<SSL_CREDENTIAL> *local_268;
  UniquePtr<spake2plus::Verifier> *local_260;
  undefined8 local_258;
  Array<unsigned_char> *local_250;
  undefined1 local_248 [8];
  uint8_t *puStack_240;
  undefined1 local_218 [8];
  SSL_SESSION *pSStack_210;
  undefined1 local_1e8 [48];
  Array<unsigned_char> local_1b8;
  InplaceVector<unsigned_char,_32UL> *local_1a0;
  SSL_SESSION *local_198;
  size_t sStack_190;
  CBB local_188;
  undefined1 local_158 [48];
  uint8_t *local_128;
  ulong local_120;
  bssl *local_108;
  size_t local_100;
  Array<unsigned_char> *local_d8;
  InplaceVector<unsigned_char,_64UL> *local_d0;
  SSL_SESSION *local_c8;
  ulong local_c0;
  undefined1 local_b8 [8];
  SSL_SESSION *pSStack_b0;
  undefined1 local_88 [48];
  SSL_SESSION *local_58;
  EVP_HPKE_CTX *local_50;
  SSL_SESSION *local_48;
  SSL_SESSION *local_40;
  SSL_SESSION *local_38;
  
  out_02 = (CBS *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8);
  local_2a0 = &hs->new_session;
  local_40 = (SSL_SESSION *)&hs->client_traffic_secret_0;
  local_268 = &hs->credential;
  local_c8 = (SSL_SESSION *)&hs->client_handshake_secret;
  local_38 = (SSL_SESSION *)&hs->early_traffic_secret;
  local_2a8 = (SSL_CLIENT_HELLO *)&hs->transcript;
  local_d0 = &hs->expected_client_finished;
  local_48 = (SSL_SESSION *)&hs->server_traffic_secret_0;
  local_1a0 = &hs->session_id;
  local_d8 = &hs->key_share_ciphertext;
  local_58 = (SSL_SESSION *)&hs->server_handshake_secret;
  local_260 = &hs->pake_verifier;
  local_50 = &(hs->ech_hpke_ctx).ctx_;
  local_250 = &hs->ech_client_hello_buf;
  do {
    local_c0 = (ulong)(uint)hs->tls13_state;
    puVar38 = &switchD_00166c86::switchdataD_0022fa90;
    sVar37 = ssl_hs_error;
    switch(local_c0) {
    case 0:
      pSVar41 = hs->ssl;
      bVar18 = SSL_HANDSHAKE::GetClientHello
                         (hs,(SSLMessage *)local_298,(SSL_CLIENT_HELLO *)local_158);
      sVar37 = ssl_hs_error;
      if (bVar18) {
        iVar23 = SSL_is_quic(pSVar41);
        if ((iVar23 == 0) || (local_120 == 0)) {
          iVar23 = SSL_is_dtls(pSVar41);
          uVar33 = local_120;
          if (iVar23 == 0) {
            if (0x20 < local_120) goto LAB_0016940b;
            (hs->session_id).size_ = '\0';
            if (local_120 != 0) {
              memmove(local_1a0,local_128,local_120);
            }
            (hs->session_id).size_ = (PackedSize<32UL>)uVar33;
          }
          local_248 = (undefined1  [8])0x0;
          puStack_240 = (uint8_t *)0x0;
          local_2c0 = pSVar41;
          bVar18 = ssl_get_full_credential_list(hs,(Array<ssl_credential_st_*> *)local_248);
          auVar16 = local_248;
          sVar37 = ssl_hs_error;
          if (bVar18) {
            if (puStack_240 == (uint8_t *)0x0) {
              iVar23 = 0x50;
              ERR_put_error(0x10,0,0xae,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                            ,0x14e);
            }
            else {
              local_258 = (long)puStack_240 << 3;
              uVar33 = 0;
              do {
                cred = *(SSL_CREDENTIAL **)
                        (((InplaceVector<unsigned_char,_64UL> *)((long)auVar16 + 10))->storage_ +
                        (uVar33 - 10));
                ERR_clear_error();
                SVar2 = cred->type;
                if (SVar2 == kSPAKE2PlusV1Server) {
                  pSVar6 = (hs->pake_share)._M_t.
                           super___uniq_ptr_impl<bssl::SSLPAKEShare,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_bssl::SSLPAKEShare_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_bssl::SSLPAKEShare_*,_false>._M_head_impl;
                  if ((((((pSVar6 != (SSLPAKEShare *)0x0) && (pSVar6->named_pake == 0x7d96)) &&
                        (sVar7 = (pSVar6->client_identity).size_,
                        sVar7 == (cred->client_identity).size_)) &&
                       ((sVar7 == 0 ||
                        (iVar23 = bcmp((pSVar6->client_identity).data_,(cred->client_identity).data_
                                       ,sVar7), iVar23 == 0)))) &&
                      (sVar7 = (pSVar6->server_identity).size_,
                      sVar7 == (cred->server_identity).size_)) &&
                     ((sVar7 == 0 ||
                      (iVar23 = bcmp((pSVar6->server_identity).data_,(cred->server_identity).data_,
                                     sVar7), iVar23 == 0)))) {
                    SSL_CREDENTIAL_up_ref(cred);
                    local_1e8._0_8_ =
                         (__uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>)0x0;
                    std::__uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>::reset
                              ((__uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter> *)
                               local_268,cred);
                    std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>::~unique_ptr
                              ((unique_ptr<ssl_credential_st,_bssl::internal::Deleter> *)local_1e8);
                    pVVar34 = New<bssl::spake2plus::Verifier>();
                    pUVar15 = local_260;
                    local_1e8._0_8_ =
                         (__uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>)0x0;
                    std::__uniq_ptr_impl<bssl::spake2plus::Verifier,_bssl::internal::Deleter>::reset
                              ((__uniq_ptr_impl<bssl::spake2plus::Verifier,_bssl::internal::Deleter>
                                *)local_260,pVVar34);
                    std::unique_ptr<bssl::spake2plus::Verifier,_bssl::internal::Deleter>::
                    ~unique_ptr((unique_ptr<bssl::spake2plus::Verifier,_bssl::internal::Deleter> *)
                                local_1e8);
                    pVVar34 = (pUVar15->_M_t).
                              super___uniq_ptr_impl<bssl::spake2plus::Verifier,_bssl::internal::Deleter>
                              ._M_t.
                              super__Tuple_impl<0UL,_bssl::spake2plus::Verifier_*,_bssl::internal::Deleter>
                              .super__Head_base<0UL,_bssl::spake2plus::Verifier_*,_false>.
                              _M_head_impl;
                    if (pVVar34 != (Verifier *)0x0) {
                      context.data_ = (cred->pake_context).data_;
                      context.size_ = (cred->pake_context).size_;
                      id_prover.data_ = (cred->client_identity).data_;
                      id_prover.size_ = (cred->client_identity).size_;
                      pAVar43 = &cred->server_identity;
                      local_1e8._0_8_ = pAVar43->data_;
                      in_stack_fffffffffffffd00 = (SSL_SESSION *)(cred->server_identity).size_;
                      id_verifier.data_ = pAVar43->data_;
                      id_verifier.size_ = pAVar43->size_;
                      pAVar43 = &cred->password_verifier_w0;
                      local_218._0_2_ = SUB82(pAVar43->data_,0);
                      local_218._2_6_ = (undefined6)((ulong)pAVar43->data_ >> 0x10);
                      pSStack_210 = (SSL_SESSION *)(cred->password_verifier_w0).size_;
                      w0.data_ = pAVar43->data_;
                      w0.size_ = pAVar43->size_;
                      pAVar43 = &cred->registration_record;
                      local_88._0_8_ = pAVar43->data_;
                      local_88._8_8_ = (cred->registration_record).size_;
                      registration_record.data_ = pAVar43->data_;
                      registration_record.size_ = pAVar43->size_;
                      local_b8 = (undefined1  [8])0x0;
                      pSStack_b0 = (SSL_SESSION *)0x0;
                      uVar47 = (undefined4)local_1e8._0_8_;
                      uVar48 = (undefined4)((ulong)local_1e8._0_8_ >> 0x20);
                      local_1e8._8_8_ = in_stack_fffffffffffffd00;
                      bVar18 = spake2plus::Verifier::Init
                                         (pVVar34,context,id_prover,id_verifier,w0,
                                          registration_record,(Span<const_unsigned_char>)ZEXT816(0))
                      ;
                      out_02 = (CBS *)CONCAT44(uVar48,uVar47);
                      if (bVar18) break;
                    }
                    ssl_send_alert(local_2c0,2,0x50);
                    goto LAB_0016851e;
                  }
                  ERR_put_error(0x10,0,0x146,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                                ,0x12a);
                }
                else if (SVar2 == kX509) {
LAB_0016814a:
                  bVar18 = tls1_choose_signature_algorithm(hs,cred,(uint16_t *)local_218);
                  if ((bVar18) &&
                     (bVar18 = ssl_credential_matches_requested_issuers(hs,cred), bVar18)) {
                    SSL_CREDENTIAL_up_ref(cred);
                    local_1e8._0_8_ =
                         (__uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>)0x0;
                    std::__uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>::reset
                              ((__uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter> *)
                               local_268,cred);
                    std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>::~unique_ptr
                              ((unique_ptr<ssl_credential_st,_bssl::internal::Deleter> *)local_1e8);
                    hs->signature_algorithm = local_218._0_2_;
                    break;
                  }
                }
                else {
                  if (SVar2 == kDelegated) {
                    puVar31 = (hs->peer_sigalgs).data_;
                    puVar31 = std::
                              __find_if<unsigned_short*,__gnu_cxx::__ops::_Iter_equals_val<unsigned_short_const>>
                                        (puVar31,puVar31 + (hs->peer_sigalgs).size_,
                                         &cred->dc_algorithm);
                    if (puVar31 != (hs->peer_sigalgs).data_ + (hs->peer_sigalgs).size_)
                    goto LAB_0016814a;
                    iVar24 = 0x10e;
                    iVar23 = 0xfd;
                  }
                  else {
                    iVar24 = 0x113;
                    iVar23 = 0xe4;
                  }
                  ERR_put_error(0x10,0,iVar23,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                                ,iVar24);
                }
                uVar33 = uVar33 + 8;
              } while (local_258 != uVar33);
              sVar28 = local_100;
              this = local_108;
              if ((local_268->_M_t).
                  super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl ==
                  (ssl_credential_st *)0x0) {
                uVar33 = ERR_peek_error();
                iVar23 = 0x28;
                if ((int)uVar33 == 0) {
                  __assert_fail("ERR_peek_error() != 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                                ,0x16f,
                                "enum ssl_hs_wait_t bssl::do_select_parameters(SSL_HANDSHAKE *)");
                }
              }
              else {
                uVar21 = ssl_protocol_version(local_2c0);
                pSVar39 = (local_2c0->config)._M_t.
                          super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>._M_t.
                          super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl;
                if ((*(ushort *)&pSVar39->field_0x10d >> 0xb & 1) == 0) {
                  uVar27 = EVP_has_aes_hardware();
                  pSVar39 = (local_2c0->config)._M_t.
                            super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl;
                }
                else {
                  uVar27 = *(ushort *)&pSVar39->field_0x10d >> 0xc & 1;
                }
                cipher_suites.len._0_1_ = uVar27 != 0;
                cipher_suites.data = (uint8_t *)sVar28;
                cipher_suites.len._1_7_ = 0;
                pSVar32 = ssl_choose_tls13_cipher
                                    (this,cipher_suites,SUB21(uVar21,0),
                                     (uint16_t)pSVar39->compliance_policy,
                                     (ssl_compliance_policy_t)in_R9);
                hs->new_cipher = pSVar32;
                if (pSVar32 != (SSL_CIPHER *)0x0) {
                  local_188.child = (CBB *)CONCAT71(local_188.child._1_7_,0x32);
                  bVar18 = ssl_negotiate_alpn(hs,(uint8_t *)&local_188,(SSL_CLIENT_HELLO *)local_158
                                             );
                  if (bVar18) {
                    uVar21 = ssl_protocol_version(local_2c0);
                    bVar18 = SSLTranscript::InitHash
                                       ((SSLTranscript *)local_2a8,uVar21,hs->new_cipher);
                    if (bVar18) {
                      hs->tls13_state = 1;
                      sVar37 = ssl_hs_ok;
                      goto LAB_0016851e;
                    }
                  }
                  else {
                    ssl_send_alert(local_2c0,2,(uint)(byte)local_188.child);
                  }
                  sVar37 = ssl_hs_error;
                  goto LAB_0016851e;
                }
                iVar23 = 0x28;
                ERR_put_error(0x10,0,0xb8,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                              ,0x177);
              }
            }
            ssl_send_alert(local_2c0,2,iVar23);
          }
LAB_0016851e:
          OPENSSL_free((void *)local_248);
        }
        else {
          ERR_put_error(0x10,0,0x132,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                        ,0x13c);
LAB_00166cee:
          iVar23 = 0x2f;
LAB_00166cf8:
          ssl_send_alert(pSVar41,2,iVar23);
          sVar37 = ssl_hs_error;
        }
      }
      break;
    case 1:
      pSVar41 = hs->ssl;
      bVar18 = SSL_HANDSHAKE::GetClientHello
                         (hs,(SSLMessage *)local_298,(SSL_CLIENT_HELLO *)local_158);
      sVar37 = ssl_hs_error;
      if (bVar18) {
        local_2c1 = true;
        pSVar29 = pSVar41->s3;
        pSVar5 = hs->ssl;
        local_2b8.data_ = (uchar *)0x0;
        bVar18 = ssl_client_hello_get_extension((SSL_CLIENT_HELLO *)local_158,(CBS *)local_248,0x29)
        ;
        if (!bVar18) goto LAB_00168683;
        bVar19 = ssl_client_hello_get_extension((SSL_CLIENT_HELLO *)local_158,(CBS *)local_1e8,0x2d)
        ;
        if (bVar19) {
          out_02 = (CBS *)local_248;
          in_R9 = (SSL_CLIENT_HELLO *)local_158;
          bVar19 = ssl_ext_pre_shared_key_parse_clienthello
                             (hs,(CBS *)local_218,(CBS *)local_88,(uint32_t *)&local_198,&local_2c1,
                              in_R9,out_02);
          bVar35 = local_2c1;
          if (!bVar19) goto LAB_00168706;
          if (((hs->field_0x6c8 & 0x10) != 0) &&
             ((psVar3 = (local_268->_M_t).
                        super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl,
              psVar3 == (ssl_credential_st *)0x0 || (psVar3->type != kSPAKE2PlusV1Server)))) {
            local_188.child = (CBB *)0x0;
            ticket.data_._2_6_ = local_218._2_6_;
            ticket.data_._0_2_ = local_218._0_2_;
            ticket.size_ = (size_t)pSStack_210;
            local_b8 = (undefined1  [8])0x0;
            pSStack_b0 = (SSL_SESSION *)0x0;
            uVar47 = 0;
            uVar48 = 0;
            in_stack_fffffffffffffd00 = (SSL_SESSION *)0x0;
            sVar25 = ssl_process_ticket(hs,(UniquePtr<SSL_SESSION> *)&local_188,(bool *)&local_1b8,
                                        ticket,(Span<const_unsigned_char>)ZEXT816(0));
            if (sVar25 == ssl_ticket_aead_success) {
              bVar19 = ssl_session_is_resumable(hs,(SSL_SESSION *)local_188.child);
              if ((bVar19) && ((*(undefined1 *)((long)local_188.child + 0x1b8) & 8) != 0)) {
                local_198 = (SSL_SESSION *)
                            CONCAT44(local_198._4_4_,
                                     ((int)local_198 - *(uint32_t *)((long)local_188.child + 0x180))
                                     / 1000);
                OVar46 = ssl_ctx_get_current_time
                                   ((pSVar5->ctx)._M_t.
                                    super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                                    super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                                    super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
                if (OVar46.tv_sec < *(uint64_t *)((long)local_188.child + 0xd0)) {
                  __assert_fail("now.tv_sec >= session->time",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                                ,0x1d5,
                                "enum ssl_ticket_aead_result_t bssl::select_session(SSL_HANDSHAKE *, uint8_t *, UniquePtr<SSL_SESSION> *, int32_t *, bool *, const SSLMessage &, const SSL_CLIENT_HELLO *)"
                               );
                }
                uVar33 = OVar46.tv_sec - *(uint64_t *)((long)local_188.child + 0xd0);
                if (uVar33 < 0x80000000) {
                  pSVar29->ticket_age_skew = (int)local_198 - (int)uVar33;
                  bVar19 = tls13_verify_psk_binder
                                     (hs,(SSL_SESSION *)local_188.child,(SSLMessage *)local_298,
                                      (CBS *)local_88);
                  __p_00 = local_188.child;
                  bVar35 = 0x33;
                  if (bVar19) {
                    local_188.child = (CBB *)0x0;
                    std::__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>::reset
                              ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *)
                               &local_2b8,(pointer)__p_00);
                    std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
                              ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&local_188);
                    SSL_SESSION_dup((bssl *)local_248,(SSL_SESSION *)local_2b8.data_,0);
                    auVar16 = local_248;
                    pUVar14 = local_2a0;
                    local_248 = (undefined1  [8])0x0;
                    std::__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>::reset
                              ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *)local_2a0
                               ,(pointer)auVar16);
                    std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
                              ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)local_248);
                    out_02 = (CBS *)CONCAT44(uVar48,uVar47);
                    if ((pUVar14->_M_t).
                        super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl !=
                        (ssl_session_st *)0x0) {
                      puVar40 = &pSVar41->s3->field_0xdc;
                      *(ushort *)puVar40 = *(ushort *)puVar40 | 0x20;
                      hs->field_0x6ca = hs->field_0x6ca | 0x80;
                      ssl_session_renew_timeout
                                (pSVar41,(hs->new_session)._M_t.
                                         super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                         .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                         _M_head_impl,
                                 ((pSVar41->session_ctx)._M_t.
                                  super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                                  super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->
                                 session_psk_dhe_timeout);
                      out_02 = (CBS *)CONCAT44(uVar48,uVar47);
                      goto LAB_0016869d;
                    }
                    bVar35 = 0x50;
                    goto LAB_00168706;
                  }
                  goto LAB_00167781;
                }
              }
              std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
                        ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&local_188);
              out_02 = (CBS *)CONCAT44(uVar48,uVar47);
              goto LAB_00168683;
            }
            bVar35 = 0x50;
            if (sVar25 == ssl_ticket_aead_error) {
LAB_00167781:
              local_2c1 = (bool)bVar35;
              std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
                        ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&local_188);
              out_02 = (CBS *)CONCAT44(uVar48,uVar47);
              bVar35 = local_2c1;
              goto LAB_00168706;
            }
            std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&local_188);
            out_02 = (CBS *)CONCAT44(uVar48,uVar47);
            if (sVar25 != ssl_ticket_aead_retry) {
              if (sVar25 == ssl_ticket_aead_ignore_ticket) goto LAB_00168683;
              goto LAB_0016869d;
            }
            hs->tls13_state = 1;
            sVar37 = ssl_hs_pending_ticket;
            goto LAB_00168719;
          }
LAB_00168683:
          if ((SSL_SESSION *)local_2b8.data_ != (SSL_SESSION *)0x0) {
            __assert_fail("!session",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                          ,0x20a,"enum ssl_hs_wait_t bssl::do_select_session(SSL_HANDSHAKE *)");
          }
          bVar19 = ssl_get_new_session(hs);
          bVar35 = 0x50;
          if (!bVar19) goto LAB_00168706;
LAB_0016869d:
          bVar19 = ssl_negotiate_alps(hs,&local_2c1,(SSL_CLIENT_HELLO *)local_158);
          bVar35 = local_2c1;
          if (!bVar19) goto LAB_00168706;
          ((hs->new_session)._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
           _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->cipher = hs->new_cipher;
          if ((hs->pake_verifier)._M_t.
              super___uniq_ptr_impl<bssl::spake2plus::Verifier,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_bssl::spake2plus::Verifier_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_bssl::spake2plus::Verifier_*,_false>._M_head_impl ==
              (Verifier *)0x0) {
            bVar19 = tls1_get_shared_group
                               (hs,&((hs->new_session)._M_t.
                                     super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                                     _M_t.
                                     super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                     .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->
                                    group_id);
            if (!bVar19) {
              iVar23 = 0x28;
              ERR_put_error(0x10,0,0x10a,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                            ,0x23b);
              goto LAB_00168d9a;
            }
            bVar19 = ssl_ext_key_share_parse_clienthello
                               (hs,(bool *)local_248,(Span<const_unsigned_char> *)0x0,&local_2c1,
                                (SSL_CLIENT_HELLO *)local_158);
            if (bVar19) {
              local_258 = CONCAT44(local_258._4_4_,(int)CONCAT71(extraout_var,local_248[0])) ^ 1;
              goto LAB_001686e0;
            }
            ssl_send_alert(pSVar41,2,(uint)local_2c1);
            goto LAB_00168716;
          }
          local_258 = local_258 & 0xffffffff00000000;
LAB_001686e0:
          puVar30 = local_2b8.data_;
          if ((pSVar41->field_0xa4 & 4) == 0) {
            pSVar29 = pSVar41->s3;
            pSVar29->early_data_reason = ssl_early_data_disabled;
          }
          else if (bVar18) {
            if ((SSL_SESSION *)local_2b8.data_ == (SSL_SESSION *)0x0) {
              pSVar29 = pSVar41->s3;
              pSVar29->early_data_reason = ssl_early_data_session_not_resumed;
            }
            else if (*(uint32_t *)((long)local_2b8.data_ + 0x184) == 0) {
              pSVar29 = pSVar41->s3;
              pSVar29->early_data_reason = ssl_early_data_unsupported_for_session;
            }
            else if ((*(uint *)&hs->field_0x6c8 >> 0xb & 1) == 0) {
              pSVar29 = pSVar41->s3;
              pSVar29->early_data_reason = ssl_early_data_peer_declined;
            }
            else {
              pSVar29 = pSVar41->s3;
              if ((*(uint *)&hs->field_0x6c8 >> 0x18 & 1) == 0) {
                sVar7 = (pSVar29->alpn_selected).size_;
                if ((sVar7 == ((Array<unsigned_char> *)((long)local_2b8.data_ + 0x188))->size_) &&
                   ((sVar7 == 0 ||
                    (iVar23 = bcmp((pSVar29->alpn_selected).data_,
                                   ((Array<unsigned_char> *)((long)local_2b8.data_ + 0x188))->data_,
                                   sVar7), iVar23 == 0)))) {
                  psVar8 = (local_2a0->_M_t).
                           super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
                  if (((((*(undefined1 *)((long)puVar30 + 0x1b8) ^ psVar8->field_0x1b8) & 0x40) == 0
                       ) && (sVar7 = (psVar8->local_application_settings).size_,
                            sVar7 == ((Array<unsigned_char> *)((long)puVar30 + 0x198))->size_)) &&
                     ((sVar7 == 0 ||
                      (iVar23 = bcmp((psVar8->local_application_settings).data_,
                                     ((Array<unsigned_char> *)((long)puVar30 + 0x198))->data_,sVar7)
                      , iVar23 == 0)))) {
                    if (pSVar29->ticket_age_skew - 0x3dU < 0xffffff87) {
                      pSVar29->early_data_reason = ssl_early_data_ticket_age_skew;
                    }
                    else {
                      bVar18 = quic_ticket_compatible((SSL_SESSION *)puVar30,hs->config);
                      if (bVar18) {
                        if ((char)local_258 == '\0') {
                          if (hs->new_cipher != *(SSL_CIPHER **)((long)local_2b8.data_ + 0xd8)) {
                            __assert_fail("hs->new_cipher == session->cipher",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                                          ,0x269,
                                          "enum ssl_hs_wait_t bssl::do_select_session(SSL_HANDSHAKE *)"
                                         );
                          }
                          pSVar29 = pSVar41->s3;
                          pSVar29->early_data_reason = ssl_early_data_accepted;
                          puVar40 = &pSVar29->field_0xdd;
                          *puVar40 = *puVar40 | 2;
                          pSVar29 = pSVar41->s3;
                        }
                        else {
                          pSVar29 = pSVar41->s3;
                          pSVar29->early_data_reason = ssl_early_data_hello_retry_request;
                        }
                      }
                      else {
                        pSVar29 = pSVar41->s3;
                        pSVar29->early_data_reason = ssl_early_data_quic_parameter_mismatch;
                      }
                    }
                  }
                  else {
                    pSVar29->early_data_reason = ssl_early_data_alps_mismatch;
                  }
                }
                else {
                  pSVar29->early_data_reason = ssl_early_data_alpn_mismatch;
                }
              }
              else {
                pSVar29->early_data_reason = ssl_early_data_channel_id;
              }
            }
          }
          else {
            pSVar29 = pSVar41->s3;
            pSVar29->early_data_reason = ssl_early_data_no_session_offered;
          }
          puVar30 = (pSVar29->alpn_selected).data_;
          sVar28 = (pSVar29->alpn_selected).size_;
          pAVar43 = &((local_2a0->_M_t).
                      super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->early_alpn;
          bVar18 = Array<unsigned_char>::InitUninitialized(pAVar43,sVar28);
          if (bVar18 && sVar28 != 0) {
            memmove(pAVar43->data_,puVar30,sVar28);
          }
          iVar23 = 0x50;
          if (!bVar18) {
LAB_00168d9a:
            ssl_send_alert(pSVar41,2,iVar23);
            goto LAB_00168716;
          }
          if (((pSVar41->s3->field_0xdd & 2) != 0) &&
             (psVar8 = (local_2a0->_M_t).
                       super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,
             (psVar8->field_0x1b8 & 0x40) != 0)) {
            local_2c0 = (SSL *)((Array<unsigned_char> *)((long)local_2b8.data_ + 0x1a8))->data_;
            sVar28 = ((Array<unsigned_char> *)((long)local_2b8.data_ + 0x1a8))->size_;
            pAVar43 = &psVar8->peer_application_settings;
            bVar18 = Array<unsigned_char>::InitUninitialized(pAVar43,sVar28);
            if (bVar18 && sVar28 != 0) {
              memmove(pAVar43->data_,local_2c0,sVar28);
            }
            if (!bVar18) goto LAB_00168d9a;
          }
          if (((pSVar41->field_0xa4 & 4) != 0) && (iVar24 = SSL_is_quic(pSVar41), iVar24 != 0)) {
            local_2c0 = (SSL *)(hs->config->quic_early_data_context).data_;
            sVar28 = (hs->config->quic_early_data_context).size_;
            pAVar43 = &((hs->new_session)._M_t.
                        super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->
                       quic_early_data_context;
            bVar18 = Array<unsigned_char>::InitUninitialized(pAVar43,sVar28);
            if (bVar18 && sVar28 != 0) {
              memmove(pAVar43->data_,local_2c0,sVar28);
            }
            if (!bVar18) goto LAB_00168d9a;
          }
          p_Var9 = ((pSVar41->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>.
                    _M_t.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->dos_protection_cb;
          if ((p_Var9 != (_func_int_SSL_CLIENT_HELLO_ptr *)0x0) &&
             (iVar24 = (*p_Var9)((SSL_CLIENT_HELLO *)local_158), iVar24 == 0)) {
            ERR_put_error(0x10,0,0x85,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                          ,0x28e);
            goto LAB_00168d9a;
          }
          uVar21 = ssl_protocol_version(pSVar41);
          md = (EVP_MD *)ssl_get_handshake_digest(uVar21,hs->new_cipher);
          iVar23 = EVP_MD_size(md);
          uVar33 = CONCAT44(extraout_var_00,iVar23);
          puVar40 = kZeroes;
          if ((pSVar41->s3->field_0xdc & 0x20) != 0) {
            psVar8 = (local_2a0->_M_t).
                     super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
            uVar33 = (ulong)(psVar8->secret).size_;
            puVar40 = (psVar8->secret).storage_;
          }
          psk.size_ = uVar33;
          psk.data_ = puVar40;
          bVar18 = tls13_init_key_schedule(hs,psk);
          sVar36 = ssl_hs_error;
          sVar42 = ssl_hs_error;
          sVar37 = sVar36;
          if ((bVar18) && (bVar18 = ssl_hash_message(hs,(SSLMessage *)local_298), bVar18)) {
            uVar27 = *(uint *)&pSVar41->s3->field_0xdc;
            sVar37 = sVar42;
            if ((uVar27 >> 9 & 1) == 0) {
              if ((hs->field_0x6c9 & 8) != 0) {
                *(ushort *)&pSVar41->s3->field_0xdc = (ushort)uVar27 | 1;
              }
            }
            else {
              bVar18 = tls13_derive_early_secret(hs);
              if (!bVar18) goto LAB_00168719;
            }
            if ((char)local_258 == '\0') {
              if ((local_260->_M_t).
                  super___uniq_ptr_impl<bssl::spake2plus::Verifier,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_bssl::spake2plus::Verifier_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_bssl::spake2plus::Verifier_*,_false>._M_head_impl ==
                  (Verifier *)0x0) {
                bVar18 = resolve_ecdhe_secret(hs,(SSL_CLIENT_HELLO *)local_158);
              }
              else {
                if ((pSVar41->s3->field_0xdc & 0x20) != 0) {
                  __assert_fail("!ssl->s3->session_reused",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                                ,0x2b0,"enum ssl_hs_wait_t bssl::do_select_session(SSL_HANDSHAKE *)"
                               );
                }
                bVar18 = ssl_credential_st::ClaimPAKEAttempt
                                   ((local_268->_M_t).
                                    super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>
                                    .super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl)
                ;
                if (!bVar18) {
                  ERR_put_error(0x10,0,0x145,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                                ,0x2b4);
                  ssl_send_alert(hs->ssl,2,0x50);
                  goto LAB_00168719;
                }
                bVar18 = resolve_pake_secret(hs);
              }
              if (bVar18 != false) {
                (*pSVar41->method->next_message)(pSVar41);
                OPENSSL_free(local_250->data_);
                local_250->data_ = (uchar *)0x0;
                local_250->size_ = 0;
                hs->tls13_state = 4;
                goto LAB_00168e73;
              }
            }
            else {
              (*pSVar41->method->next_message)(pSVar41);
              bVar18 = SSLTranscript::UpdateForHelloRetryRequest((SSLTranscript *)local_2a8);
              sVar37 = sVar36;
              if (bVar18) {
                hs->tls13_state = 2;
LAB_00168e73:
                sVar37 = ssl_hs_ok;
              }
            }
          }
        }
        else {
          local_2c1 = true;
          ERR_put_error(0x10,0,0xa4,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                        ,0x1a1);
          bVar35 = local_2c1;
LAB_00168706:
          ssl_send_alert(pSVar41,2,(uint)bVar35);
LAB_00168716:
          sVar37 = ssl_hs_error;
        }
LAB_00168719:
        std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&local_2b8);
      }
      break;
    case 2:
      sVar37 = ssl_hs_hints_ready;
      if ((hs->field_0x6ca & 0x10) == 0) {
        if ((local_260->_M_t).
            super___uniq_ptr_impl<bssl::spake2plus::Verifier,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_bssl::spake2plus::Verifier_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_bssl::spake2plus::Verifier_*,_false>._M_head_impl !=
            (Verifier *)0x0) {
          __assert_fail("hs->pake_verifier == nullptr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                        ,0x2cf,
                        "enum ssl_hs_wait_t bssl::do_send_hello_retry_request(SSL_HANDSHAKE *)");
        }
        pSVar41 = hs->ssl;
        CBB_zero((CBB *)local_158);
        bVar18 = (*pSVar41->method->init_message)(pSVar41,(CBB *)local_158,(CBB *)local_298,'\x02');
        sVar37 = ssl_hs_error;
        sVar36 = ssl_hs_error;
        if (bVar18) {
          iVar23 = SSL_is_dtls(pSVar41);
          uVar21 = 0xfefd;
          if (iVar23 == 0) {
            uVar21 = 0x303;
          }
          iVar23 = CBB_add_u16((CBB *)local_298,uVar21);
          if ((((iVar23 != 0) &&
               (iVar23 = CBB_add_bytes((CBB *)local_298,kHelloRetryRequest,0x20), iVar23 != 0)) &&
              (iVar23 = CBB_add_u8_length_prefixed((CBB *)local_298,(CBB *)local_248),
              sVar37 = sVar36, iVar23 != 0)) &&
             (iVar23 = CBB_add_bytes((CBB *)local_248,(uint8_t *)local_1a0,
                                     (ulong)(hs->session_id).size_), iVar23 != 0)) {
            uVar21 = SSL_CIPHER_get_protocol_id(hs->new_cipher);
            iVar23 = CBB_add_u16((CBB *)local_298,uVar21);
            if (((((iVar23 != 0) && (iVar23 = CBB_add_u8((CBB *)local_298,'\0'), iVar23 != 0)) &&
                 ((iVar23 = CBB_add_u16_length_prefixed((CBB *)local_298,(CBB *)local_1e8),
                  iVar23 != 0 &&
                  ((iVar23 = CBB_add_u16((CBB *)local_1e8,0x2b), iVar23 != 0 &&
                   (iVar23 = CBB_add_u16((CBB *)local_1e8,2), iVar23 != 0)))))) &&
                ((iVar23 = CBB_add_u16((CBB *)local_1e8,pSVar41->s3->version), iVar23 != 0 &&
                 (((iVar23 = CBB_add_u16((CBB *)local_1e8,0x33), iVar23 != 0 &&
                   (iVar23 = CBB_add_u16((CBB *)local_1e8,2), iVar23 != 0)) &&
                  (iVar23 = CBB_add_u16((CBB *)local_1e8,
                                        ((local_2a0->_M_t).
                                         super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                         .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                        _M_head_impl)->group_id), iVar23 != 0)))))) &&
               (((hs->field_0x6c8 & 1) == 0 ||
                (((iVar23 = CBB_add_u16((CBB *)local_1e8,0xfe0d), iVar23 != 0 &&
                  (iVar23 = CBB_add_u16((CBB *)local_1e8,8), iVar23 != 0)) &&
                 (iVar23 = CBB_add_zeros((CBB *)local_1e8,8), iVar23 != 0)))))) {
              local_218._0_2_ = 0;
              local_218._2_6_ = 0;
              pSStack_210 = (SSL_SESSION *)0x0;
              bVar18 = (*pSVar41->method->finish_message)
                                 (pSVar41,(CBB *)local_158,(Array<unsigned_char> *)local_218);
              uVar47 = (undefined4)((ulong)out_02 >> 0x20);
              sVar37 = ssl_hs_error;
              if (bVar18) {
                if ((hs->field_0x6c8 & 1) != 0) {
                  if (pSStack_210 < (SSL_SESSION *)0x8) goto LAB_0016940b;
                  in_stack_fffffffffffffd00 =
                       (SSL_SESSION *)CONCAT62(local_218._2_6_,local_218._0_2_);
                  out_00.data_ = (pSStack_210->secret).storage_ +
                                 (long)&in_stack_fffffffffffffd00[-1].field_0x1be;
                  client_random.data_ = pSVar41->s3->client_random;
                  local_88._8_8_ = pSStack_210;
                  uVar48 = 1;
                  msg_00.size_ = (size_t)pSStack_210;
                  msg_00.data_ = (uchar *)in_stack_fffffffffffffd00;
                  client_random.size_ = 0x20;
                  out_00.size_ = 8;
                  in_R9 = local_2a8;
                  local_88._0_8_ = in_stack_fffffffffffffd00;
                  bVar18 = ssl_ech_accept_confirmation
                                     (hs,out_00,client_random,(SSLTranscript *)local_2a8,true,msg_00
                                      ,(size_t)&pSStack_210[-1].quic_early_data_context.size_);
                  out_02 = (CBS *)CONCAT44(uVar47,uVar48);
                  if (!bVar18) goto LAB_001690d2;
                }
                p_Var10 = pSVar41->method->add_message;
                local_b8 = (undefined1  [8])0x0;
                pSStack_b0 = (SSL_SESSION *)0x0;
                OPENSSL_free((void *)0x0);
                local_b8 = (undefined1  [8])CONCAT62(local_218._2_6_,local_218._0_2_);
                pSStack_b0 = pSStack_210;
                local_218._0_2_ = 0;
                local_218._2_6_ = 0;
                pSStack_210 = (SSL_SESSION *)0x0;
                AVar44.size_ = extraout_RDX;
                AVar44.data_ = local_b8;
                bVar18 = (*p_Var10)(pSVar41,AVar44);
                if (bVar18) {
                  bVar18 = (*pSVar41->method->add_change_cipher_spec)(pSVar41);
                  Array<unsigned_char>::~Array((Array<unsigned_char> *)local_b8);
                  if (bVar18) {
                    puVar40 = &pSVar41->s3->field_0xdc;
                    *(ushort *)puVar40 = *(ushort *)puVar40 | 0x1000;
                    hs->tls13_state = 3;
                    sVar37 = ssl_hs_flush;
                  }
                }
                else {
                  Array<unsigned_char>::~Array((Array<unsigned_char> *)local_b8);
                  sVar37 = ssl_hs_error;
                }
              }
LAB_001690d2:
              Array<unsigned_char>::~Array((Array<unsigned_char> *)local_218);
            }
          }
        }
        CBB_cleanup((CBB *)local_158);
      }
      break;
    case 3:
      pSVar41 = hs->ssl;
      bVar18 = (*pSVar41->method->get_message)(pSVar41,(SSLMessage *)local_298);
      sVar37 = ssl_hs_read_message;
      if (bVar18) {
        bVar18 = ssl_check_message_type(pSVar41,(SSLMessage *)local_298,1);
        sVar37 = ssl_hs_error;
        if (bVar18) {
          iVar23 = SSL_parse_client_hello
                             (pSVar41,(SSL_CLIENT_HELLO *)local_158,local_290,
                              (size_t)aStack_288.base.buf);
          if (iVar23 == 0) {
            uVar27 = 0x32;
            client_hello_00 = in_R9;
            goto LAB_001685d8;
          }
          pSVar29 = pSVar41->s3;
          pCVar49 = out_02;
          if (pSVar29->ech_status == ssl_ech_accepted) {
            bVar18 = ssl_client_hello_get_extension
                               ((SSL_CLIENT_HELLO *)local_158,(CBS *)local_248,0xfe0d);
            if (!bVar18) {
              ERR_put_error(0x10,0,0xa4,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                            ,0x31b);
              iVar23 = 0x6d;
              goto LAB_00166cf8;
            }
            iVar24 = CBS_get_u8((CBS *)local_248,(uint8_t *)&local_2b8);
            ctx = local_50;
            iVar23 = 0x32;
            line = 0x32a;
            if ((iVar24 != 0) && ((char)local_2b8.data_ == '\0')) {
              iVar24 = CBS_get_u16((CBS *)local_248,(uint16_t *)local_b8);
              if ((iVar24 != 0) &&
                 ((((iVar24 = CBS_get_u16((CBS *)local_248,(uint16_t *)&local_188), iVar24 != 0 &&
                    (iVar24 = CBS_get_u8((CBS *)local_248,(uint8_t *)&local_198), iVar24 != 0)) &&
                   (iVar24 = CBS_get_u16_length_prefixed((CBS *)local_248,(CBS *)local_1e8),
                   iVar24 != 0)) &&
                  ((iVar24 = CBS_get_u16_length_prefixed((CBS *)local_248,(CBS *)local_218),
                   iVar24 != 0 && (puStack_240 == (uint8_t *)0x0)))))) {
                uVar17 = local_b8._0_2_;
                kdf = EVP_HPKE_CTX_kdf(ctx);
                uVar21 = EVP_HPKE_KDF_id(kdf);
                line = 0x333;
                if (uVar17 == uVar21) {
                  uVar21 = (uint16_t)local_188.child;
                  aead = EVP_HPKE_CTX_aead(ctx);
                  uVar20 = EVP_HPKE_AEAD_id(aead);
                  if (uVar21 == uVar20) {
                    iVar23 = 0x2f;
                    if (((uint8_t)local_198 == hs->ech_config_id) &&
                       ((SSL_SESSION *)local_1e8._8_8_ == (SSL_SESSION *)0x0)) {
                      local_1b8.data_ = (uchar *)CONCAT71(local_1b8.data_._1_7_,0x32);
                      local_88._0_8_ = CONCAT62(local_218._2_6_,local_218._0_2_);
                      local_88._8_8_ = pSStack_210;
                      uVar47 = (undefined4)local_88._0_8_;
                      uVar48 = SUB64(local_218._2_6_,2);
                      payload.data_._4_4_ = uVar48;
                      payload.data_._0_4_ = uVar47;
                      payload.size_ = (size_t)pSStack_210;
                      in_stack_fffffffffffffd00 = pSStack_210;
                      bVar18 = ssl_client_hello_decrypt
                                         (hs,(uint8_t *)&local_1b8,&local_2c1,local_250,
                                          (SSL_CLIENT_HELLO *)local_158,payload);
                      if (!bVar18) {
                        ERR_put_error(0x10,0,0x8a,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                                      ,0x33f);
                        out_02 = (CBS *)CONCAT44(uVar48,uVar47);
                        uVar27 = (uint)(byte)local_1b8.data_;
                        client_hello_00 = in_R9;
                        goto LAB_001685d8;
                      }
                      bVar18 = SSL_HANDSHAKE::GetClientHello
                                         (hs,(SSLMessage *)local_298,(SSL_CLIENT_HELLO *)local_158);
                      out_02 = (CBS *)CONCAT44(uVar48,uVar47);
                      if (!bVar18) {
                        iVar23 = 0x346;
                        goto LAB_001682ae;
                      }
                      pSVar29 = pSVar41->s3;
                      pCVar49 = out_02;
                      goto LAB_00167579;
                    }
                    goto LAB_00168a28;
                  }
                }
                iVar23 = 0x2f;
              }
            }
LAB_00168a28:
            ERR_put_error(0x10,0,0x89,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                          ,line);
            goto LAB_00166cf8;
          }
LAB_00167579:
          out_02 = pCVar49;
          if ((pSVar29->field_0xdc & 0x20) != 0) {
            client_hello_00 = (SSL_CLIENT_HELLO *)local_158;
            out_02 = (CBS *)local_248;
            bVar18 = ssl_client_hello_get_extension(client_hello_00,out_02,0x29);
            if (!bVar18) {
              ERR_put_error(0x10,0,0x12f,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                            ,0x356);
              out_02 = pCVar49;
              goto LAB_00166cee;
            }
            local_188.child = (CBB *)CONCAT71(local_188.child._1_7_,0x32);
            bVar18 = ssl_ext_pre_shared_key_parse_clienthello
                               (hs,(CBS *)local_1e8,(CBS *)local_218,(uint32_t *)local_b8,
                                (uint8_t *)&local_188,client_hello_00,out_02);
            if (bVar18) {
              bVar18 = tls13_verify_psk_binder
                                 (hs,(hs->new_session)._M_t.
                                     super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                                     _M_t.
                                     super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                     .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,
                                  (SSLMessage *)local_298,(CBS *)local_218);
              uVar27 = 0x33;
              in_R9 = client_hello_00;
              if (bVar18) goto LAB_0016758e;
            }
            else {
              uVar27 = (uint)(byte)local_188.child;
            }
LAB_001685d8:
            ssl_send_alert(pSVar41,2,uVar27);
            in_R9 = client_hello_00;
            goto LAB_001685dd;
          }
LAB_0016758e:
          if ((local_260->_M_t).
              super___uniq_ptr_impl<bssl::spake2plus::Verifier,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_bssl::spake2plus::Verifier_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_bssl::spake2plus::Verifier_*,_false>._M_head_impl !=
              (Verifier *)0x0) {
            __assert_fail("hs->pake_verifier == nullptr",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                          ,0x370,
                          "enum ssl_hs_wait_t bssl::do_read_second_client_hello(SSL_HANDSHAKE *)");
          }
          bVar18 = resolve_ecdhe_secret(hs,(SSL_CLIENT_HELLO *)local_158);
          sVar37 = ssl_hs_error;
          if ((bVar18) && (bVar18 = ssl_hash_message(hs,(SSLMessage *)local_298), bVar18)) {
            bVar18 = (*pSVar41->method->has_unprocessed_handshake_data)(pSVar41);
            if (bVar18) {
              ssl_send_alert(pSVar41,2,10);
              iVar23 = 0xff;
              iVar24 = 0x37c;
              goto LAB_001682e6;
            }
            (*pSVar41->method->next_message)(pSVar41);
            OPENSSL_free((hs->ech_client_hello_buf).data_);
            local_250->data_ = (uchar *)0x0;
            local_250->size_ = 0;
            hs->tls13_state = 4;
            goto LAB_00167b18;
          }
        }
      }
      break;
    case 4:
      pSVar41 = hs->ssl;
      pSVar29 = pSVar41->s3;
      puVar1 = pSVar29->server_random;
      pSVar4 = (hs->hints)._M_t.
               super___uniq_ptr_impl<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_false>._M_head_impl;
      if (pSVar4 == (SSL_HANDSHAKE_HINTS *)0x0) {
        RAND_bytes(puVar1,0x20);
      }
      else if (((hs->field_0x6ca & 0x10) == 0) && ((pSVar4->server_random_tls13).size_ == 0x20)) {
        puVar30 = (pSVar4->server_random_tls13).data_;
        uVar11 = *(undefined8 *)puVar30;
        uVar12 = *(undefined8 *)(puVar30 + 8);
        uVar13 = *(undefined8 *)(puVar30 + 0x18);
        *(undefined8 *)(pSVar29->server_random + 0x10) = *(undefined8 *)(puVar30 + 0x10);
        *(undefined8 *)(pSVar29->server_random + 0x18) = uVar13;
        *(undefined8 *)puVar1 = uVar11;
        *(undefined8 *)(pSVar29->server_random + 8) = uVar12;
      }
      else {
        RAND_bytes(puVar1,0x20);
        if ((hs->field_0x6ca & 0x10) != 0) {
          bVar18 = Array<unsigned_char>::InitUninitialized(&pSVar4->server_random_tls13,0x20);
          sVar37 = ssl_hs_error;
          if (!bVar18) break;
          puVar30 = (pSVar4->server_random_tls13).data_;
          uVar11 = *(undefined8 *)puVar1;
          uVar12 = *(undefined8 *)(pSVar29->server_random + 8);
          uVar13 = *(undefined8 *)(pSVar29->server_random + 0x18);
          *(undefined8 *)(puVar30 + 0x10) = *(undefined8 *)(pSVar29->server_random + 0x10);
          *(undefined8 *)(puVar30 + 0x18) = uVar13;
          *(undefined8 *)puVar30 = uVar11;
          *(undefined8 *)(puVar30 + 8) = uVar12;
        }
      }
      local_2b8.data_ = (uchar *)0x0;
      local_2b8.size_ = 0;
      CBB_zero((CBB *)local_158);
      bVar18 = (*pSVar41->method->init_message)(pSVar41,(CBB *)local_158,(CBB *)local_298,'\x02');
      sVar37 = ssl_hs_error;
      if (bVar18) {
        iVar23 = SSL_is_dtls(pSVar41);
        uVar21 = 0xfefd;
        if (iVar23 == 0) {
          uVar21 = 0x303;
        }
        iVar23 = CBB_add_u16((CBB *)local_298,uVar21);
        if (((iVar23 != 0) &&
            (iVar23 = CBB_add_bytes((CBB *)local_298,pSVar41->s3->server_random,0x20), iVar23 != 0))
           && ((iVar23 = CBB_add_u8_length_prefixed((CBB *)local_298,(CBB *)local_1e8), iVar23 != 0
               && (iVar23 = CBB_add_bytes((CBB *)local_1e8,(uint8_t *)local_1a0,
                                          (ulong)(hs->session_id).size_), iVar23 != 0)))) {
          uVar21 = SSL_CIPHER_get_protocol_id(hs->new_cipher);
          iVar23 = CBB_add_u16((CBB *)local_298,uVar21);
          if ((((((iVar23 != 0) && (iVar23 = CBB_add_u8((CBB *)local_298,'\0'), iVar23 != 0)) &&
                (iVar23 = CBB_add_u16_length_prefixed((CBB *)local_298,(CBB *)local_248),
                iVar23 != 0)) &&
               ((bVar18 = ssl_ext_pre_shared_key_add_serverhello(hs,(CBB *)local_248), bVar18 &&
                (bVar18 = ssl_ext_pake_add_serverhello(hs,(CBB *)local_248), bVar18)))) &&
              (bVar18 = ssl_ext_key_share_add_serverhello(hs,(CBB *)local_248), bVar18)) &&
             (iVar23 = ssl_ext_supported_versions_add_serverhello(hs,(CBB *)local_248), iVar23 != 0)
             ) {
            bVar18 = (*pSVar41->method->finish_message)(pSVar41,(CBB *)local_158,&local_2b8);
            uVar47 = (undefined4)((ulong)out_02 >> 0x20);
            if (bVar18) {
              if (pSVar41->s3->ech_status == ssl_ech_accepted) {
                if ((hs->field_0x6c8 & 1) == 0) {
                  __assert_fail("ssl->s3->ech_status != ssl_ech_accepted || hs->ech_is_inner",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                                ,0x3ae,
                                "enum ssl_hs_wait_t bssl::do_send_server_hello(SSL_HANDSHAKE *)");
                }
LAB_00168eb7:
                sVar28 = ssl_ech_confirmation_signal_hello_offset(pSVar41);
                client_random_00.data_ = pSVar41->s3->client_random;
                local_198 = (SSL_SESSION *)local_2b8.data_;
                sStack_190 = local_2b8.size_;
                uVar48 = 0;
                msg_01.size_ = local_2b8.size_;
                msg_01.data_ = local_2b8.data_;
                client_random_00.size_ = 0x20;
                out_01.size_ = 8;
                out_01.data_ = pSVar29->server_random + 0x18;
                in_R9 = local_2a8;
                in_stack_fffffffffffffd00 = (SSL_SESSION *)local_2b8.data_;
                bVar18 = ssl_ech_accept_confirmation
                                   (hs,out_01,client_random_00,(SSLTranscript *)local_2a8,false,
                                    msg_01,sVar28);
                out_02 = (CBS *)CONCAT44(uVar47,uVar48);
                if (!bVar18) goto LAB_00169332;
                if (local_2b8.size_ < sVar28) {
LAB_0016940b:
                  abort();
                }
                *(undefined8 *)
                 (((InplaceVector<unsigned_char,_64UL> *)((long)local_2b8.data_ + 10))->storage_ +
                 (sVar28 - 10)) = *(undefined8 *)(pSVar29->server_random + 0x18);
              }
              else if ((hs->field_0x6c8 & 1) != 0) goto LAB_00168eb7;
              p_Var10 = pSVar41->method->add_message;
              local_1b8.data_ = (uchar *)0x0;
              local_1b8.size_ = 0;
              OPENSSL_free((void *)0x0);
              local_1b8.data_ = local_2b8.data_;
              local_1b8.size_ = local_2b8.size_;
              local_2b8.data_ = (uchar *)0x0;
              local_2b8.size_ = 0;
              AVar45.size_ = extraout_RDX_00;
              AVar45.data_ = (uchar *)&local_1b8;
              bVar18 = (*p_Var10)(pSVar41,AVar45);
              Array<unsigned_char>::~Array(&local_1b8);
              if (bVar18) {
                OPENSSL_free(local_d8->data_);
                local_d8->data_ = (uchar *)0x0;
                local_d8->size_ = 0;
                if ((((pSVar41->s3->field_0xdd & 0x10) != 0) ||
                    (bVar18 = (*pSVar41->method->add_change_cipher_spec)(pSVar41), bVar18)) &&
                   (bVar18 = tls13_derive_handshake_secrets(hs), bVar18)) {
                  in_R9 = (SSL_CLIENT_HELLO *)(ulong)(hs->server_handshake_secret).size_;
                  traffic_secret_04.size_ = (size_t)in_stack_fffffffffffffd00;
                  traffic_secret_04.data_ = (uchar *)out_02;
                  bVar18 = tls13_set_traffic_key
                                     ((bssl *)pSVar41,(SSL *)0x2,ssl_encryption_early_data,
                                      (evp_aead_direction_t)
                                      (hs->new_session)._M_t.
                                      super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                      .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,
                                      local_58,traffic_secret_04);
                  if ((((bVar18) &&
                       (bVar18 = (*pSVar41->method->init_message)
                                           (pSVar41,(CBB *)local_158,(CBB *)local_298,'\b'), bVar18)
                       ) && (bVar18 = ssl_add_serverhello_tlsext(hs,(CBB *)local_298), bVar18)) &&
                     (bVar18 = ssl_add_message_cbb(pSVar41,(CBB *)local_158), bVar18)) {
                    if ((pSVar41->s3->field_0xdc & 0x20) == 0) {
                      uVar27 = *(uint *)&hs->field_0x6c8;
                      if ((hs->pake_verifier)._M_t.
                          super___uniq_ptr_impl<bssl::spake2plus::Verifier,_bssl::internal::Deleter>
                          ._M_t.
                          super__Tuple_impl<0UL,_bssl::spake2plus::Verifier_*,_bssl::internal::Deleter>
                          .super__Head_base<0UL,_bssl::spake2plus::Verifier_*,_false>._M_head_impl
                          == (Verifier *)0x0) {
                        uVar27 = uVar27 & 0xffffffdf | (*(uint *)&hs->config->verify_mode & 1) << 5;
                        *(uint *)&hs->field_0x6c8 = uVar27;
                      }
                    }
                    else {
                      uVar27 = *(uint *)&hs->field_0x6c8;
                    }
                    if (((uVar27 & 0x20) == 0) ||
                       ((((((bVar18 = (*pSVar41->method->init_message)
                                                (pSVar41,(CBB *)local_158,(CBB *)local_298,'\r'),
                            bVar18 && (iVar23 = CBB_add_u8((CBB *)local_298,'\0'), iVar23 != 0)) &&
                           ((iVar23 = CBB_add_u16_length_prefixed((CBB *)local_298,(CBB *)local_218)
                            , iVar23 != 0 &&
                            ((iVar23 = CBB_add_u16((CBB *)local_218,0xd), iVar23 != 0 &&
                             (iVar23 = CBB_add_u16_length_prefixed((CBB *)local_218,(CBB *)local_88)
                             , iVar23 != 0)))))) &&
                          (iVar23 = CBB_add_u16_length_prefixed((CBB *)local_88,(CBB *)local_b8),
                          iVar23 != 0)) &&
                         (bVar18 = tls12_add_verify_sigalgs(hs,(CBB *)local_b8), bVar18)) &&
                        (((bVar18 = ssl_has_client_CAs(hs->config), !bVar18 ||
                          ((((iVar23 = CBB_add_u16((CBB *)local_218,0x2f), iVar23 != 0 &&
                             (iVar23 = CBB_add_u16_length_prefixed((CBB *)local_218,&local_188),
                             iVar23 != 0)) &&
                            (bVar18 = ssl_add_client_CA_list(hs,&local_188), bVar18)) &&
                           (iVar23 = CBB_flush((CBB *)local_218), iVar23 != 0)))) &&
                         (bVar18 = ssl_add_message_cbb(pSVar41,(CBB *)local_158), bVar18)))))) {
                      if (((pSVar41->s3->field_0xdc & 0x20) == 0) &&
                         ((local_260->_M_t).
                          super___uniq_ptr_impl<bssl::spake2plus::Verifier,_bssl::internal::Deleter>
                          ._M_t.
                          super__Tuple_impl<0UL,_bssl::spake2plus::Verifier_*,_bssl::internal::Deleter>
                          .super__Head_base<0UL,_bssl::spake2plus::Verifier_*,_false>._M_head_impl
                          == (Verifier *)0x0)) {
                        bVar18 = tls13_add_certificate(hs);
                        if (!bVar18) goto LAB_00169332;
                        hs->tls13_state = 5;
                      }
                      else {
                        hs->tls13_state = 6;
                      }
                      sVar37 = ssl_hs_ok;
                    }
                  }
                }
              }
            }
          }
        }
      }
LAB_00169332:
      CBB_cleanup((CBB *)local_158);
      OPENSSL_free(local_2b8.data_);
      break;
    case 5:
      sVar26 = tls13_add_certificate_verify(hs);
      if (sVar26 == ssl_private_key_success) {
        sVar37 = ssl_hs_ok;
        iVar23 = 6;
      }
      else {
        sVar37 = ssl_hs_error;
        if (sVar26 == ssl_private_key_failure) break;
        if (sVar26 != ssl_private_key_retry) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                        ,0x41c,
                        "enum ssl_hs_wait_t bssl::do_send_server_certificate_verify(SSL_HANDSHAKE *)"
                       );
        }
        sVar37 = ssl_hs_private_key_operation;
        iVar23 = 5;
      }
LAB_00167f4a:
      hs->tls13_state = iVar23;
      break;
    case 6:
      sVar37 = ssl_hs_hints_ready;
      if ((*(uint *)&hs->field_0x6c8 >> 0x14 & 1) == 0) {
        pSVar41 = hs->ssl;
        *(uint *)&hs->field_0x6c8 = *(uint *)&hs->field_0x6c8 | 0x800000;
        bVar18 = tls13_add_finished(hs);
        sVar37 = ssl_hs_error;
        if (bVar18) {
          puVar30 = (uchar *)SSLTranscript::DigestLen((SSLTranscript *)local_2a8);
          in_02.size_ = (size_t)puVar38;
          in_02.data_ = puVar30;
          bVar18 = tls13_advance_key_schedule((bssl *)hs,(SSL_HANDSHAKE *)kZeroes,in_02);
          sVar37 = ssl_hs_error;
          if (bVar18) {
            bVar18 = tls13_derive_application_secrets(hs);
            sVar37 = ssl_hs_error;
            if (bVar18) {
              in_R9 = (SSL_CLIENT_HELLO *)(ulong)(hs->server_traffic_secret_0).size_;
              traffic_secret_01.size_ = (size_t)in_stack_fffffffffffffd00;
              traffic_secret_01.data_ = (uchar *)out_02;
              bVar18 = tls13_set_traffic_key
                                 ((bssl *)pSVar41,(SSL *)0x3,ssl_encryption_early_data,
                                  (evp_aead_direction_t)
                                  (hs->new_session)._M_t.
                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,
                                  local_48,traffic_secret_01);
              sVar37 = ssl_hs_error;
              if (bVar18) {
                hs->tls13_state = 7;
                sVar37 = ssl_hs_handback;
                if ((hs->field_0x6ca & 8) == 0) {
                  sVar37 = ssl_hs_ok;
                }
              }
            }
          }
        }
      }
      break;
    case 7:
      if ((hs->ssl->s3->field_0xdd & 2) == 0) {
LAB_00167628:
        hs->tls13_state = 8;
LAB_0016762f:
        sVar37 = ssl_hs_flush;
      }
      else {
        iVar23 = SSL_is_quic(hs->ssl);
        if ((iVar23 != 0) ||
           (in.size_ = 4, in.data_ = "\x05",
           bVar18 = SSLTranscript::Update((SSLTranscript *)local_2a8,in), bVar18)) {
          sVar28 = SSLTranscript::DigestLen((SSLTranscript *)local_2a8);
          out = local_d0;
          InplaceVector<unsigned_char,_64UL>::Resize(local_d0,sVar28);
          bVar18 = tls13_finished_mac(hs,(uint8_t *)out,(size_t *)local_158,false);
          if (bVar18) {
            if (CONCAT71(local_158._1_7_,local_158[0]) ==
                (ulong)(hs->expected_client_finished).size_) {
              iVar23 = SSL_is_dtls(hs->ssl);
              if (iVar23 != 0) {
                __assert_fail("!SSL_is_dtls(hs->ssl)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                              ,0x456,
                              "enum ssl_hs_wait_t bssl::do_send_half_rtt_ticket(SSL_HANDSHAKE *)");
              }
              local_298[0] = true;
              local_298[1] = '\0';
              local_298._2_2_ = (ushort)(hs->expected_client_finished).size_ << 8;
              in_00.size_ = 4;
              in_00.data_ = local_298;
              bVar18 = SSLTranscript::Update((SSLTranscript *)local_2a8,in_00);
              if (((bVar18) &&
                  (in_01.size_._0_1_ = (hs->expected_client_finished).size_,
                  in_01.data_ = (uchar *)local_d0, in_01.size_._1_7_ = 0,
                  bVar18 = SSLTranscript::Update((SSLTranscript *)local_2a8,in_01), bVar18)) &&
                 (bVar18 = tls13_derive_resumption_secret(hs), bVar18)) {
                bVar18 = add_new_session_tickets(hs,(bool *)local_248);
                sVar37 = ssl_hs_error;
                if (!bVar18) break;
                goto LAB_00167628;
              }
            }
            else {
              iVar23 = 0x44d;
LAB_001682ae:
              ERR_put_error(0x10,0,0x44,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                            ,iVar23);
            }
          }
LAB_001685dd:
          sVar37 = ssl_hs_error;
        }
        else {
          iVar23 = 0x44;
          iVar24 = 0x441;
LAB_001682e6:
          ERR_put_error(0x10,0,iVar23,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                        ,iVar24);
          sVar37 = ssl_hs_error;
        }
      }
      break;
    case 8:
      pSVar41 = hs->ssl;
      if ((pSVar41->s3->field_0xdd & 2) != 0) {
        in_R9 = (SSL_CLIENT_HELLO *)(ulong)(hs->early_traffic_secret).size_;
        traffic_secret_02.size_ = (size_t)in_stack_fffffffffffffd00;
        traffic_secret_02.data_ = (uchar *)out_02;
        bVar18 = tls13_set_traffic_key
                           ((bssl *)pSVar41,(SSL *)0x1,ssl_encryption_initial,
                            (evp_aead_direction_t)
                            (hs->new_session)._M_t.
                            super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,local_38,
                            traffic_secret_02);
        sVar37 = ssl_hs_error;
        if (!bVar18) break;
        hs->field_0x6c9 = hs->field_0x6c9 | 0x34;
      }
      bVar18 = uses_end_of_early_data(pSVar41);
      sVar36 = ssl_hs_read_end_of_early_data;
      if (!bVar18) {
        in_R9 = (SSL_CLIENT_HELLO *)(ulong)(hs->client_handshake_secret).size_;
        traffic_secret_03.size_ = (size_t)in_stack_fffffffffffffd00;
        traffic_secret_03.data_ = (uchar *)out_02;
        bVar18 = tls13_set_traffic_key
                           ((bssl *)pSVar41,(SSL *)0x2,ssl_encryption_initial,
                            (evp_aead_direction_t)
                            (hs->new_session)._M_t.
                            super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,local_c8,
                            traffic_secret_03);
        sVar36 = ssl_hs_early_return;
        sVar37 = ssl_hs_error;
        if (!bVar18) break;
      }
      hs->tls13_state = 9;
      sVar37 = sVar36;
      if ((pSVar41->s3->field_0xdd & 2) == 0) {
        sVar37 = ssl_hs_ok;
      }
      break;
    case 9:
      pSVar41 = hs->ssl;
      bVar18 = uses_end_of_early_data(pSVar41);
      if (bVar18) {
        if ((hs->ssl->s3->field_0xdd & 2) == 0) {
LAB_00166f32:
          in_R9 = (SSL_CLIENT_HELLO *)(ulong)(hs->client_handshake_secret).size_;
          traffic_secret_00.size_ = (size_t)in_stack_fffffffffffffd00;
          traffic_secret_00.data_ = (uchar *)out_02;
          bVar18 = tls13_set_traffic_key
                             ((bssl *)pSVar41,(SSL *)0x2,ssl_encryption_initial,
                              (evp_aead_direction_t)
                              (hs->new_session)._M_t.
                              super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,local_c8,
                              traffic_secret_00);
          sVar37 = ssl_hs_error;
          if (bVar18) goto LAB_00166f63;
        }
        else {
          bVar18 = (*pSVar41->method->get_message)(pSVar41,(SSLMessage *)local_158);
          sVar37 = ssl_hs_read_message;
          if (bVar18) {
            bVar18 = ssl_check_message_type(pSVar41,(SSLMessage *)local_158,5);
            sVar37 = ssl_hs_error;
            if (bVar18) {
              if ((uint8_t *)local_158._16_8_ != (uint8_t *)0x0) {
                ssl_send_alert(pSVar41,2,0x32);
                iVar23 = 0x89;
                iVar24 = 0x49d;
                goto LAB_001682e6;
              }
              (*pSVar41->method->next_message)(pSVar41);
              goto LAB_00166f32;
            }
          }
        }
      }
      else {
LAB_00166f63:
        hs->tls13_state = 10;
LAB_00167b18:
        sVar37 = ssl_hs_ok;
      }
      break;
    case 10:
      if (((((hs->new_session)._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
             _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->field_0x1b8 & 0x40) == 0)
         || (pSVar41 = hs->ssl, (pSVar41->s3->field_0xdd & 2) != 0)) {
LAB_00167a54:
        hs->tls13_state = 0xb;
        goto LAB_00167b18;
      }
      bVar18 = (*pSVar41->method->get_message)(pSVar41,(SSLMessage *)local_158);
      sVar37 = ssl_hs_read_message;
      if (bVar18) {
        bVar18 = ssl_check_message_type(pSVar41,(SSLMessage *)local_158,8);
        sVar37 = ssl_hs_error;
        if (bVar18) {
          local_248 = (undefined1  [8])local_158._8_8_;
          puStack_240 = (uint8_t *)local_158._16_8_;
          iVar23 = CBS_get_u16_length_prefixed((CBS *)local_248,(CBS *)local_1e8);
          if ((iVar23 != 0) && (puStack_240 == (uint8_t *)0x0)) {
            local_298[0] = true;
            local_298[1] = 'D';
            if ((*(ushort *)&hs->config->field_0x10d >> 0xd & 1) == 0) {
              local_298[0] = true;
              local_298[1] = 'D';
            }
            local_298._2_2_ = 1;
            local_290 = (uint8_t *)0x0;
            aStack_288.base.buf = (uint8_t *)0x0;
            local_88[0] = 0x32;
            local_218._0_2_ = SUB82(local_298,0);
            local_218._2_6_ = (undefined6)((ulong)local_298 >> 0x10);
            bVar18 = ssl_parse_extensions
                               ((bssl *)local_1e8,(CBS *)local_88,local_218,
                                (initializer_list<bssl::SSLExtension_*>)ZEXT816(1),SUB81(in_R9,0));
            uVar11 = aStack_288.base.buf;
            puVar1 = local_290;
            if (bVar18) {
              if (local_298[3] == '\0') {
                ERR_put_error(0x10,0,0xa4,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                              ,0x4d0);
                uVar27 = 0x6d;
                client_hello_00 = in_R9;
              }
              else {
                pAVar43 = &((local_2a0->_M_t).
                            super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->
                           peer_application_settings;
                bVar18 = Array<unsigned_char>::InitUninitialized
                                   (pAVar43,(size_t)aStack_288.base.buf);
                if ((uint8_t *)uVar11 != (uint8_t *)0x0 && bVar18) {
                  memmove(pAVar43->data_,puVar1,uVar11);
                }
                uVar27 = 0x50;
                client_hello_00 = in_R9;
                if ((bVar18) &&
                   (bVar18 = ssl_hash_message(hs,(SSLMessage *)local_158), client_hello_00 = in_R9,
                   bVar18)) {
                  (*pSVar41->method->next_message)(pSVar41);
                  goto LAB_00167a54;
                }
              }
            }
            else {
              uVar27 = (uint)local_88[0];
              client_hello_00 = in_R9;
            }
            goto LAB_001685d8;
          }
          ERR_put_error(0x10,0,0x89,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                        ,0x4be);
          iVar23 = 0x32;
          goto LAB_00166cf8;
        }
      }
      break;
    case 0xb:
      pSVar41 = hs->ssl;
      if ((hs->field_0x6c8 & 0x20) == 0) {
        if ((pSVar41->s3->field_0xdc & 0x20) == 0) {
          ((local_2a0->_M_t).super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->verify_result = 0;
        }
LAB_00167b11:
        hs->tls13_state = 0xd;
        goto LAB_00167b18;
      }
      bVar35 = hs->config->verify_mode;
      bVar18 = (*pSVar41->method->get_message)(pSVar41,(SSLMessage *)local_158);
      sVar37 = ssl_hs_read_message;
      if (bVar18) {
        bVar18 = ssl_check_message_type(pSVar41,(SSLMessage *)local_158,0xb);
        sVar37 = ssl_hs_error;
        if (((bVar18) &&
            (bVar18 = tls13_process_certificate(hs,(SSLMessage *)local_158,(bVar35 & 2) == 0),
            bVar18)) && (bVar18 = ssl_hash_message(hs,(SSLMessage *)local_158), bVar18)) {
          (*pSVar41->method->next_message)(pSVar41);
          hs->tls13_state = 0xc;
          goto LAB_00167b18;
        }
      }
      break;
    case 0xc:
      pSVar41 = hs->ssl;
      sVar28 = OPENSSL_sk_num((OPENSSL_STACK *)
                              (((hs->new_session)._M_t.
                                super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                                super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->certs)
                              ._M_t.
                              super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>
                             );
      if (sVar28 == 0) goto LAB_00167b11;
      bVar18 = (*pSVar41->method->get_message)(pSVar41,(SSLMessage *)local_158);
      sVar37 = ssl_hs_read_message;
      if (bVar18) {
        sVar22 = ssl_verify_peer_cert(hs);
        sVar37 = ssl_hs_error;
        if (sVar22 != ssl_verify_invalid) {
          if (sVar22 == ssl_verify_retry) {
            sVar37 = ssl_hs_certificate_verify;
            iVar23 = 0xc;
          }
          else {
            bVar18 = ssl_check_message_type(pSVar41,(SSLMessage *)local_158,0xf);
            if (((!bVar18) ||
                (bVar18 = tls13_process_certificate_verify(hs,(SSLMessage *)local_158), !bVar18)) ||
               (bVar18 = ssl_hash_message(hs,(SSLMessage *)local_158), !bVar18)) break;
            (*pSVar41->method->next_message)(pSVar41);
            sVar37 = ssl_hs_ok;
            iVar23 = 0xd;
          }
          goto LAB_00167f4a;
        }
      }
      break;
    case 0xd:
      if ((hs->field_0x6cb & 1) == 0) {
LAB_001677dc:
        hs->tls13_state = 0xe;
        goto LAB_00167b18;
      }
      pSVar41 = hs->ssl;
      bVar18 = (*pSVar41->method->get_message)(pSVar41,(SSLMessage *)local_158);
      sVar37 = ssl_hs_read_message;
      if (bVar18) {
        bVar18 = ssl_check_message_type(pSVar41,(SSLMessage *)local_158,0xcb);
        sVar37 = ssl_hs_error;
        if (((bVar18) && (bVar18 = tls1_verify_channel_id(hs,(SSLMessage *)local_158), bVar18)) &&
           (bVar18 = ssl_hash_message(hs,(SSLMessage *)local_158), bVar18)) {
          (*pSVar41->method->next_message)(pSVar41);
          goto LAB_001677dc;
        }
      }
      break;
    case 0xe:
      pSVar41 = hs->ssl;
      bVar18 = (*pSVar41->method->get_message)(pSVar41,(SSLMessage *)local_158);
      sVar37 = ssl_hs_read_message;
      if (bVar18) {
        bVar18 = ssl_check_message_type(pSVar41,(SSLMessage *)local_158,0x14);
        sVar37 = ssl_hs_error;
        if ((bVar18) &&
           (bVar18 = tls13_process_finished
                               (hs,(SSLMessage *)local_158,
                                (bool)((byte)((ushort)*(undefined2 *)&pSVar41->s3->field_0xdc >> 9)
                                      & 1)), bVar18)) {
          in_R9 = (SSL_CLIENT_HELLO *)(ulong)(hs->client_traffic_secret_0).size_;
          sVar37 = ssl_hs_error;
          traffic_secret.size_ = (size_t)in_stack_fffffffffffffd00;
          traffic_secret.data_ = (uchar *)out_02;
          bVar18 = tls13_set_traffic_key
                             ((bssl *)pSVar41,(SSL *)0x3,ssl_encryption_initial,
                              (evp_aead_direction_t)
                              (hs->new_session)._M_t.
                              super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,local_40,
                              traffic_secret);
          if (bVar18) {
            iVar23 = 0x10;
            if ((pSVar41->s3->field_0xdd & 2) != 0) {
LAB_00166ddb:
              hs->tls13_state = iVar23;
              psVar3 = (hs->credential)._M_t.
                       super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl;
              if ((psVar3 != (ssl_credential_st *)0x0) && (psVar3->type == kSPAKE2PlusV1Server)) {
                ssl_credential_st::RestorePAKEAttempt(psVar3);
              }
              (*pSVar41->method->next_message)(pSVar41);
              iVar23 = SSL_is_dtls(pSVar41);
              if (iVar23 != 0) {
                (*pSVar41->method->schedule_ack)(pSVar41);
                goto LAB_0016762f;
              }
              goto LAB_00167b18;
            }
            bVar18 = ssl_hash_message(hs,(SSLMessage *)local_158);
            if (bVar18) {
              bVar18 = tls13_derive_resumption_secret(hs);
              iVar23 = 0xf;
              if (bVar18) goto LAB_00166ddb;
            }
          }
        }
      }
      break;
    case 0xf:
      pSVar41 = hs->ssl;
      bVar18 = add_new_session_tickets(hs,(bool *)local_158);
      sVar37 = ssl_hs_error;
      if (bVar18) {
        hs->tls13_state = 0x10;
        sVar37 = ssl_hs_ok;
        if (local_158[0] == true) {
          iVar23 = SSL_is_dtls(pSVar41);
          sVar37 = ssl_hs_flush;
          if (iVar23 == 0) {
            iVar23 = SSL_is_quic(pSVar41);
            sVar37 = (uint)(iVar23 != 0) * 3 + ssl_hs_ok;
          }
        }
      }
      break;
    case 0x10:
      return ssl_hs_ok;
    }
    if (hs->tls13_state != (int)local_c0) {
      ssl_do_info_callback(hs->ssl,0x2001,1);
    }
    if (sVar37 != ssl_hs_ok) {
      return sVar37;
    }
  } while( true );
}

Assistant:

enum ssl_hs_wait_t tls13_server_handshake(SSL_HANDSHAKE *hs) {
  while (hs->tls13_state != state13_done) {
    enum ssl_hs_wait_t ret = ssl_hs_error;
    enum tls13_server_hs_state_t state =
        static_cast<enum tls13_server_hs_state_t>(hs->tls13_state);
    switch (state) {
      case state13_select_parameters:
        ret = do_select_parameters(hs);
        break;
      case state13_select_session:
        ret = do_select_session(hs);
        break;
      case state13_send_hello_retry_request:
        ret = do_send_hello_retry_request(hs);
        break;
      case state13_read_second_client_hello:
        ret = do_read_second_client_hello(hs);
        break;
      case state13_send_server_hello:
        ret = do_send_server_hello(hs);
        break;
      case state13_send_server_certificate_verify:
        ret = do_send_server_certificate_verify(hs);
        break;
      case state13_send_server_finished:
        ret = do_send_server_finished(hs);
        break;
      case state13_send_half_rtt_ticket:
        ret = do_send_half_rtt_ticket(hs);
        break;
      case state13_read_second_client_flight:
        ret = do_read_second_client_flight(hs);
        break;
      case state13_process_end_of_early_data:
        ret = do_process_end_of_early_data(hs);
        break;
      case state13_read_client_encrypted_extensions:
        ret = do_read_client_encrypted_extensions(hs);
        break;
      case state13_read_client_certificate:
        ret = do_read_client_certificate(hs);
        break;
      case state13_read_client_certificate_verify:
        ret = do_read_client_certificate_verify(hs);
        break;
      case state13_read_channel_id:
        ret = do_read_channel_id(hs);
        break;
      case state13_read_client_finished:
        ret = do_read_client_finished(hs);
        break;
      case state13_send_new_session_ticket:
        ret = do_send_new_session_ticket(hs);
        break;
      case state13_done:
        ret = ssl_hs_ok;
        break;
    }

    if (hs->tls13_state != state) {
      ssl_do_info_callback(hs->ssl, SSL_CB_ACCEPT_LOOP, 1);
    }

    if (ret != ssl_hs_ok) {
      return ret;
    }
  }

  return ssl_hs_ok;
}